

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

char * ImParseFormatSanitizeForScanning(char *fmt_in,char *fmt_out,size_t fmt_out_size)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  bool bVar4;
  bool bVar5;
  
  pbVar2 = (byte *)ImParseFormatFindEnd(fmt_in);
  pbVar3 = (byte *)fmt_out;
  bVar4 = false;
  while (bVar5 = bVar4, fmt_in < pbVar2) {
    bVar1 = *fmt_in;
    fmt_in = (char *)((byte *)fmt_in + 1);
    if ((bVar5) ||
       ((bVar4 = false, 9 < (byte)(bVar1 - 0x30) &&
        ((0x2e < bVar1 || (bVar4 = false, (0x480800000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0))))))
    {
      bVar4 = (bool)(bVar5 | (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
      if ((0x3b < bVar1 - 0x24) || ((0x800000000000009U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) == 0)
         ) {
        *pbVar3 = bVar1;
        pbVar3 = pbVar3 + 1;
      }
    }
  }
  *pbVar3 = 0;
  return fmt_out;
}

Assistant:

const char* ImParseFormatSanitizeForScanning(const char* fmt_in, char* fmt_out, size_t fmt_out_size)
{
    const char* fmt_end = ImParseFormatFindEnd(fmt_in);
    const char* fmt_out_begin = fmt_out;
    IM_UNUSED(fmt_out_size);
    IM_ASSERT((size_t)(fmt_end - fmt_in + 1) < fmt_out_size); // Format is too long, let us know if this happens to you!
    bool has_type = false;
    while (fmt_in < fmt_end)
    {
        char c = *fmt_in++;
        if (!has_type && ((c >= '0' && c <= '9') || c == '.' || c == '+' || c == '#'))
            continue;
        has_type |= ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z')); // Stop skipping digits
        if (c != '\'' && c != '$' && c != '_') // Custom flags provided by stb_sprintf.h. POSIX 2008 also supports '.
            *(fmt_out++) = c;
    }
    *fmt_out = 0; // Zero-terminate
    return fmt_out_begin;
}